

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# connection_impl.hpp
# Opt level: O2

void __thiscall
websocketpp::connection<websocketpp::config::asio>::send_http_request
          (connection<websocketpp::config::asio> *this)

{
  request_type *this_00;
  element_type *peVar1;
  size_type sVar2;
  basic<websocketpp::concurrency::basic,_websocketpp::log::alevel> *this_01;
  timer_handler *callback;
  char *buf;
  size_t len;
  int iVar3;
  string *psVar4;
  size_t in_RCX;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *__n;
  error_category *extraout_RDX;
  undefined1 local_c8 [32];
  undefined1 local_a8 [32];
  undefined1 local_88 [24];
  write_handler local_70;
  _Function_base local_50;
  
  log::basic<websocketpp::concurrency::basic,_websocketpp::log::alevel>::write
            ((this->m_alog).
             super___shared_ptr<websocketpp::log::basic<websocketpp::concurrency::basic,_websocketpp::log::alevel>,_(__gnu_cxx::_Lock_policy)2>
             ._M_ptr,0x400,"connection send_http_request",in_RCX);
  peVar1 = (this->m_processor).
           super___shared_ptr<websocketpp::processor::processor<websocketpp::config::asio>,_(__gnu_cxx::_Lock_policy)2>
           ._M_ptr;
  if (peVar1 != (element_type *)0x0) {
    this_00 = &this->m_request;
    std::__shared_ptr<websocketpp::uri,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
              ((__shared_ptr<websocketpp::uri,_(__gnu_cxx::_Lock_policy)2> *)(local_a8 + 0x10),
               &(this->m_uri).super___shared_ptr<websocketpp::uri,_(__gnu_cxx::_Lock_policy)2>);
    __n = &this->m_requested_subprotocols;
    iVar3 = (*peVar1->_vptr_processor[8])
                      (peVar1,this_00,
                       (__shared_ptr<websocketpp::uri,_(__gnu_cxx::_Lock_policy)2> *)
                       (local_a8 + 0x10));
    local_c8._0_4_ = iVar3;
    local_c8._8_8_ = extraout_RDX;
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_a8 + 0x18));
    if (iVar3 == 0) {
      std::__cxx11::string::string((string *)local_c8,"User-Agent",(allocator *)local_a8);
      psVar4 = http::parser::parser::get_header(&this_00->super_parser,(string *)local_c8);
      sVar2 = psVar4->_M_string_length;
      std::__cxx11::string::~string((string *)local_c8);
      if (sVar2 == 0) {
        if ((this->m_user_agent)._M_string_length == 0) {
          std::__cxx11::string::string((string *)local_c8,"User-Agent",(allocator *)local_a8);
          std::
          _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_websocketpp::utility::ci_less,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
          ::erase(&(this->m_request).super_parser.m_headers._M_t,(key_type *)local_c8);
        }
        else {
          std::__cxx11::string::string((string *)local_c8,"User-Agent",(allocator *)local_a8);
          http::parser::parser::replace_header
                    (&this_00->super_parser,(string *)local_c8,&this->m_user_agent);
        }
        std::__cxx11::string::~string((string *)local_c8);
      }
      http::parser::request::raw_abi_cxx11_((string *)local_c8,this_00);
      std::__cxx11::string::operator=((string *)&this->m_handshake_buffer,(string *)local_c8);
      std::__cxx11::string::~string((string *)local_c8);
      this_01 = (this->m_alog).
                super___shared_ptr<websocketpp::log::basic<websocketpp::concurrency::basic,_websocketpp::log::alevel>,_(__gnu_cxx::_Lock_policy)2>
                ._M_ptr;
      if ((this_01->m_static_channels & 0x400) != 0) {
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_c8
                       ,"Raw Handshake request:\n",&this->m_handshake_buffer);
        log::basic<websocketpp::concurrency::basic,_websocketpp::log::alevel>::write
                  (this_01,0x400,local_c8,(size_t)__n);
        std::__cxx11::string::~string((string *)local_c8);
      }
      callback = (timer_handler *)this->m_open_handshake_timeout_dur;
      if (0 < (long)callback) {
        get_shared((connection<websocketpp::config::asio> *)local_88);
        local_c8._0_8_ = handle_open_handshake_timeout;
        local_c8._8_8_ = (error_category *)0x0;
        local_c8._16_8_ = local_88._0_8_;
        local_c8._24_8_ = local_88._8_8_;
        local_88._0_16_ = ZEXT816(0) << 0x20;
        std::function<void(std::error_code_const&)>::
        function<std::_Bind<void(websocketpp::connection<websocketpp::config::asio>::*(std::shared_ptr<websocketpp::connection<websocketpp::config::asio>>,std::_Placeholder<1>))(std::error_code_const&)>,void>
                  ((function<void(std::error_code_const&)> *)&local_50,
                   (_Bind<void_(websocketpp::connection<websocketpp::config::asio>::*(std::shared_ptr<websocketpp::connection<websocketpp::config::asio>_>,_std::_Placeholder<1>))(const_std::error_code_&)>
                    *)local_c8);
        transport::asio::connection<websocketpp::config::asio::transport_config>::set_timer
                  ((connection<websocketpp::config::asio::transport_config> *)local_a8,(long)this,
                   callback);
        std::
        __shared_ptr<asio::basic_waitable_timer<std::chrono::_V2::steady_clock,_asio::wait_traits<std::chrono::_V2::steady_clock>_>,_(__gnu_cxx::_Lock_policy)2>
        ::operator=(&(this->m_handshake_timer).
                     super___shared_ptr<asio::basic_waitable_timer<std::chrono::_V2::steady_clock,_asio::wait_traits<std::chrono::_V2::steady_clock>_>,_(__gnu_cxx::_Lock_policy)2>
                    ,(__shared_ptr<asio::basic_waitable_timer<std::chrono::_V2::steady_clock,_asio::wait_traits<std::chrono::_V2::steady_clock>_>,_(__gnu_cxx::_Lock_policy)2>
                      *)local_a8);
        std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                  ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_a8 + 8));
        std::_Function_base::~_Function_base(&local_50);
        std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                  ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_c8 + 0x18));
        std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                  ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_88 + 8));
      }
      buf = (this->m_handshake_buffer)._M_dataplus._M_p;
      len = (this->m_handshake_buffer)._M_string_length;
      get_shared((connection<websocketpp::config::asio> *)local_a8);
      local_c8._0_8_ = handle_send_http_request;
      local_c8._8_8_ = (error_category *)0x0;
      local_c8._16_8_ = local_a8._0_8_;
      local_c8._24_8_ = local_a8._8_8_;
      local_a8._0_16_ = ZEXT816(0) << 0x20;
      std::function<void(std::error_code_const&)>::
      function<std::_Bind<void(websocketpp::connection<websocketpp::config::asio>::*(std::shared_ptr<websocketpp::connection<websocketpp::config::asio>>,std::_Placeholder<1>))(std::error_code_const&)>,void>
                ((function<void(std::error_code_const&)> *)(local_88 + 0x18),
                 (_Bind<void_(websocketpp::connection<websocketpp::config::asio>::*(std::shared_ptr<websocketpp::connection<websocketpp::config::asio>_>,_std::_Placeholder<1>))(const_std::error_code_&)>
                  *)local_c8);
      transport::asio::connection<websocketpp::config::asio::transport_config>::async_write
                (&this->super_transport_con_type,buf,len,(write_handler *)(local_88 + 0x18));
      std::_Function_base::~_Function_base((_Function_base *)(local_88 + 0x18));
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_c8 + 0x18));
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_a8 + 8));
    }
    else {
      log_err<std::error_code>(this,0x20,"Internal library error: Processor",(error_code *)local_c8)
      ;
    }
    return;
  }
  log::basic<websocketpp::concurrency::basic,_websocketpp::log::elevel>::write
            ((this->m_elog).
             super___shared_ptr<websocketpp::log::basic<websocketpp::concurrency::basic,_websocketpp::log::elevel>,_(__gnu_cxx::_Lock_policy)2>
             ._M_ptr,0x20,"Internal library error: missing processor",in_RCX);
  return;
}

Assistant:

void connection<config>::send_http_request() {
    m_alog->write(log::alevel::devel,"connection send_http_request");

    // TODO: origin header?

    // Have the protocol processor fill in the appropriate fields based on the
    // selected client version
    if (m_processor) {
        lib::error_code ec;
        ec = m_processor->client_handshake_request(m_request,m_uri,
            m_requested_subprotocols);

        if (ec) {
            log_err(log::elevel::fatal,"Internal library error: Processor",ec);
            return;
        }
    } else {
        m_elog->write(log::elevel::fatal,"Internal library error: missing processor");
        return;
    }

    // Unless the user has overridden the user agent, send generic WS++ UA.
    if (m_request.get_header("User-Agent").empty()) {
        if (!m_user_agent.empty()) {
            m_request.replace_header("User-Agent",m_user_agent);
        } else {
            m_request.remove_header("User-Agent");
        }
    }

    m_handshake_buffer = m_request.raw();

    if (m_alog->static_test(log::alevel::devel)) {
        m_alog->write(log::alevel::devel,"Raw Handshake request:\n"+m_handshake_buffer);
    }

    if (m_open_handshake_timeout_dur > 0) {
        m_handshake_timer = transport_con_type::set_timer(
            m_open_handshake_timeout_dur,
            lib::bind(
                &type::handle_open_handshake_timeout,
                type::get_shared(),
                lib::placeholders::_1
            )
        );
    }

    transport_con_type::async_write(
        m_handshake_buffer.data(),
        m_handshake_buffer.size(),
        lib::bind(
            &type::handle_send_http_request,
            type::get_shared(),
            lib::placeholders::_1
        )
    );
}